

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O3

mraa_gpio_context mraa_gpio_chardev_init(int *pins,int num_pins)

{
  _gpio_group *p_Var1;
  uint uVar2;
  int iVar3;
  mraa_pin_t meta;
  uint uVar4;
  mraa_boolean_t mVar5;
  mraa_result_t mVar6;
  mraa_gpio_context dev;
  int *piVar7;
  _gpio_group *p_Var8;
  mraa_pininfo_t *pmVar9;
  mraa_gpiod_chip_info *__ptr;
  uint *puVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  mraa_board_t *pmVar15;
  mraa_pin_t *pmVar16;
  int *piVar17;
  char *pcVar18;
  undefined8 *puVar19;
  ulong uVar20;
  size_t sVar21;
  byte bVar22;
  undefined8 auStackY_128 [7];
  undefined1 auVar23 [12];
  undefined1 in_stack_ffffffffffffff10 [40];
  undefined1 in_stack_ffffffffffffff3c [16];
  undefined1 auVar24 [12];
  mraa_gpio_context p_Var25;
  undefined1 in_stack_ffffffffffffff68 [12];
  undefined4 local_38;
  
  pmVar15 = plat;
  bVar22 = 0;
  dev = (mraa_gpio_context)calloc(1,0x88);
  if (dev == (mraa_gpio_context)0x0) {
    syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for context");
    return (mraa_gpio_context)0x0;
  }
  piVar7 = (int *)malloc((long)num_pins << 2);
  dev->pin_to_gpio_table = piVar7;
  if (piVar7 == (int *)0x0) goto LAB_0010a750;
  uVar4 = mraa_get_number_of_gpio_chips();
  dev->num_chips = uVar4;
  if (uVar4 == 0) goto LAB_0010a766;
  dev->num_pins = num_pins;
  p_Var8 = (_gpio_group *)calloc((ulong)uVar4,0x40);
  if (p_Var8 == (_gpio_group *)0x0) {
LAB_0010a750:
    pcVar18 = "[GPIOD_INTERFACE]: Failed to allocate memory for internal member";
  }
  else {
    dev->gpio_group = p_Var8;
    puVar10 = &p_Var8->gpio_chip;
    uVar12 = 0;
    do {
      *puVar10 = (uint)uVar12;
      *(uint **)(puVar10 + 3) = (uint *)0x0;
      uVar12 = uVar12 + 1;
      puVar10 = puVar10 + 0x10;
    } while (uVar4 != uVar12);
    if (0 < num_pins) {
      uVar12 = (ulong)(uint)num_pins;
      uVar20 = 0;
      piVar7 = pins;
      do {
        p_Var25 = dev;
        pins = piVar7;
        mVar5 = mraa_is_sub_platform_id(piVar7[uVar20]);
        uVar4 = piVar7[uVar20];
        if (mVar5 != 0) {
          syslog(5,"[GPIOD_INTERFACE]: init: Using sub platform for %d");
          pmVar15 = pmVar15->sub_platform;
          uVar14 = (ulong)(uint)piVar7[uVar20];
          if (pmVar15 != (mraa_board_t *)0x0) {
            uVar4 = mraa_get_sub_platform_index(piVar7[uVar20]);
            piVar7[uVar20] = uVar4;
            goto LAB_0010a505;
          }
          pcVar18 = "[GPIOD_INTERFACE]: init: Sub platform not initialised for pin %d";
LAB_0010a7d2:
          syslog(3,pcVar18,uVar14);
          goto LAB_0010a766;
        }
LAB_0010a505:
        uVar14 = (ulong)uVar4;
        if (((int)uVar4 < 0) || (pmVar15->phy_pin_count <= (int)uVar4)) {
          syslog(3,"[GPIOD_INTERFACE]: init: pin %d beyond platform pin count (%d)");
          goto LAB_0010a766;
        }
        pmVar9 = pmVar15->pins;
        if (((uint)pmVar9[uVar14].capabilities & 2) == 0) {
          pcVar18 = "[GPIOD_INTERFACE]: init: pin %d not capable of gpio";
          goto LAB_0010a7d2;
        }
        if (pmVar9[uVar14].gpio.mux_total != 0) {
          pmVar16 = &pmVar9[uVar14].gpio;
          piVar17 = (int *)&stack0xffffffffffffff68;
          for (lVar13 = 0x19; lVar13 != 0; lVar13 = lVar13 + -1) {
            *piVar17 = pmVar16->pinmap;
            pmVar16 = (mraa_pin_t *)((long)pmVar16 + (ulong)bVar22 * -8 + 4);
            piVar17 = piVar17 + (ulong)bVar22 * -2 + 1;
          }
          piVar17 = (int *)&stack0xffffffffffffff68;
          puVar19 = auStackY_128;
          for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar19 = *(undefined8 *)piVar17;
            piVar17 = piVar17 + ((ulong)bVar22 * -2 + 1) * 2;
            puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
          }
          meta.mux[2].pin = local_38;
          auVar24 = in_stack_ffffffffffffff10._12_12_;
          auVar23 = in_stack_ffffffffffffff10._24_12_;
          meta.pinmap = in_stack_ffffffffffffff10._0_4_;
          meta.parent_id = in_stack_ffffffffffffff10._4_4_;
          meta.mux_total = in_stack_ffffffffffffff10._8_4_;
          meta.mux[0].pincmd = auVar24._0_4_;
          meta.mux[0].pin = auVar24._4_4_;
          meta.mux[0].value = auVar24._8_4_;
          meta.mux[1].pincmd = auVar23._0_4_;
          meta.mux[1].pin = auVar23._4_4_;
          meta.mux[1].value = auVar23._8_4_;
          meta.mux[2].pincmd = in_stack_ffffffffffffff10._36_4_;
          auVar24 = in_stack_ffffffffffffff3c._4_12_;
          meta.mux[2].value = in_stack_ffffffffffffff3c._0_4_;
          meta.mux[3].pincmd = auVar24._0_4_;
          meta.mux[3].pin = auVar24._4_4_;
          meta.mux[3].value = auVar24._8_4_;
          meta.mux[4].pincmd = num_pins;
          meta.mux[4]._4_8_ = p_Var25;
          meta.mux[5]._0_8_ = pins;
          meta.mux[5].value = (int)uVar12;
          meta.output_enable = (int)(uVar12 >> 0x20);
          meta.complex_cap = (mraa_pin_cap_complex_t)in_stack_ffffffffffffff68._0_4_;
          meta.gpio_chip = in_stack_ffffffffffffff68._4_4_;
          meta.gpio_line = in_stack_ffffffffffffff68._8_4_;
          mVar6 = mraa_setup_mux_mapped(meta);
          if (mVar6 != MRAA_SUCCESS) {
            uVar14 = (ulong)(uint)piVar7[uVar20];
            pcVar18 = "[GPIOD_INTERFACE]: init: unable to setup muxes for pin %d";
            goto LAB_0010a7d2;
          }
          pmVar9 = pmVar15->pins;
          uVar4 = piVar7[uVar20];
        }
        uVar2 = pmVar9[(int)uVar4].gpio.gpio_chip;
        uVar4 = pmVar9[(int)uVar4].gpio.gpio_line;
        dev->pin_to_gpio_table[uVar20] = uVar2;
        p_Var1 = p_Var8 + (int)uVar2;
        dev = p_Var25;
        if (p_Var8[(int)uVar2].is_required == 0) {
          __ptr = mraa_get_chip_info_by_number(uVar2);
          if (__ptr == (mraa_gpiod_chip_info *)0x0) {
            dev = p_Var25;
            syslog(3,"[GPIOD_INTERFACE]: error getting gpio_chip_info for chip %d",(ulong)uVar2);
            goto LAB_0010a766;
          }
          p_Var1->dev_fd = __ptr->chip_fd;
          p_Var1->is_required = 1;
          p_Var1->gpiod_handle = -1;
          free(__ptr);
          dev = p_Var25;
        }
        uVar2 = p_Var1->num_gpio_lines;
        puVar10 = (uint *)realloc(p_Var1->gpio_lines,(long)(int)uVar2 * 4 + 4);
        p_Var1->gpio_lines = puVar10;
        if (puVar10 == (uint *)0x0) {
          syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
          goto LAB_0010a766;
        }
        p_Var1->num_gpio_lines = p_Var1->num_gpio_lines + 1;
        puVar10[(int)uVar2] = uVar4;
        uVar20 = uVar20 + 1;
        piVar7 = pins;
      } while (uVar12 != uVar20);
      uVar4 = dev->num_chips;
    }
    if (uVar4 == 0) {
      sVar21 = 0;
    }
    else {
      sVar21 = (size_t)uVar4;
      lVar13 = 0;
      do {
        uVar12 = (ulong)*(uint *)((long)&p_Var8->num_gpio_lines + lVar13);
        pvVar11 = calloc(uVar12,1);
        *(void **)((long)&p_Var8->rw_values + lVar13) = pvVar11;
        if (pvVar11 == (void *)0x0) {
LAB_0010a6ab:
          syslog(2,"[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
          goto LAB_0010a766;
        }
        pvVar11 = calloc(uVar12,4);
        *(void **)((long)&p_Var8->gpio_group_to_pins_table + lVar13) = pvVar11;
        if (pvVar11 == (void *)0x0) goto LAB_0010a6ab;
        *(undefined8 *)((long)&p_Var8->event_handles + lVar13) = 0;
        lVar13 = lVar13 + 0x40;
      } while (sVar21 << 6 != lVar13);
    }
    pvVar11 = calloc(sVar21,4);
    if (pvVar11 != (void *)0x0) {
      if (0 < num_pins) {
        piVar7 = dev->pin_to_gpio_table;
        uVar12 = 0;
        do {
          lVar13 = (long)piVar7[uVar12];
          iVar3 = *(int *)((long)pvVar11 + lVar13 * 4);
          p_Var8[lVar13].gpio_group_to_pins_table[iVar3] = (uint)uVar12;
          *(int *)((long)pvVar11 + lVar13 * 4) = iVar3 + 1;
          uVar12 = uVar12 + 1;
        } while ((uint)num_pins != uVar12);
      }
      free(pvVar11);
      sVar21 = (ulong)dev->num_pins << 2;
      piVar7 = (int *)malloc(sVar21);
      dev->provided_pins = piVar7;
      if (piVar7 != (int *)0x0) {
        memcpy(piVar7,pins,sVar21);
        dev->events = (mraa_gpio_events_t)0x0;
        return dev;
      }
      goto LAB_0010a750;
    }
    pcVar18 = "[GPIOD_INTERFACE]: Failed to allocate memory for local variable";
  }
  syslog(2,pcVar18);
LAB_0010a766:
  mraa_gpio_close(dev);
  return (mraa_gpio_context)0x0;
}

Assistant:

mraa_gpio_context
mraa_gpio_chardev_init(int pins[], int num_pins)
{
    int chip_id, line_offset;
    mraa_gpio_context dev;
    mraa_gpiod_group_t gpio_group;

    mraa_board_t* board = plat;

    dev = (mraa_gpio_context) calloc(1, sizeof(struct _gpio));
    if (dev == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for context");
        return NULL;
    }

    dev->pin_to_gpio_table = malloc(num_pins * sizeof(int));
    if (dev->pin_to_gpio_table == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->num_chips = mraa_get_number_of_gpio_chips();
    if (dev->num_chips <= 0) {
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->num_pins = num_pins;

    gpio_group = calloc(dev->num_chips, sizeof(struct _gpio_group));
    if (gpio_group == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    dev->gpio_group = gpio_group;

    for (int i = 0; i < dev->num_chips; ++i) {
        gpio_group[i].gpio_chip = i;
        /* Just to be sure realloc has the desired behaviour. */
        gpio_group[i].gpio_lines = NULL;
    }

    for (int i = 0; i < num_pins; ++i) {
        if (mraa_is_sub_platform_id(pins[i])) {
            syslog(LOG_NOTICE, "[GPIOD_INTERFACE]: init: Using sub platform for %d", pins[i]);
            board = board->sub_platform;
            if (board == NULL) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: Sub platform not initialised for pin %d", pins[i]);
                mraa_gpio_close(dev);
                return NULL;
            }
            pins[i] = mraa_get_sub_platform_index(pins[i]);
        }

        if (pins[i] < 0 || pins[i] >= board->phy_pin_count) {
            syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: pin %d beyond platform pin count (%d)",
                   pins[i], board->phy_pin_count);
            mraa_gpio_close(dev);
            return NULL;
        }

        if (board->pins[pins[i]].capabilities.gpio != 1) {
            syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: pin %d not capable of gpio", pins[i]);
            mraa_gpio_close(dev);
            return NULL;
        }

        if (board->pins[pins[i]].gpio.mux_total > 0) {
            if (mraa_setup_mux_mapped(board->pins[pins[i]].gpio) != MRAA_SUCCESS) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: unable to setup muxes for pin %d", pins[i]);
                mraa_gpio_close(dev);
                return NULL;
            }
        }

        chip_id = board->pins[pins[i]].gpio.gpio_chip;
        line_offset = board->pins[pins[i]].gpio.gpio_line;

        /* Map pin to _gpio_group structure. */
        dev->pin_to_gpio_table[i] = chip_id;

        if (!gpio_group[chip_id].is_required) {
            mraa_gpiod_chip_info* cinfo = mraa_get_chip_info_by_number(chip_id);
            if (!cinfo) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: error getting gpio_chip_info for chip %d", chip_id);
                mraa_gpio_close(dev);
                return NULL;
            }

            gpio_group[chip_id].dev_fd = cinfo->chip_fd;
            gpio_group[chip_id].is_required = 1;
            gpio_group[chip_id].gpiod_handle = -1;

            free(cinfo);
        }

        int line_in_group;
        line_in_group = gpio_group[chip_id].num_gpio_lines;
        gpio_group[chip_id].gpio_lines =
        realloc(gpio_group[chip_id].gpio_lines, (line_in_group + 1) * sizeof(unsigned int));
        if (gpio_group[chip_id].gpio_lines == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        gpio_group[chip_id].gpio_lines[line_in_group] = line_offset;
        gpio_group[chip_id].num_gpio_lines++;
    }

    /* Initialize rw_values for read / write multiple functions.
     * Also, allocate memory for inverse map: */
    for (int i = 0; i < dev->num_chips; ++i) {
        gpio_group[i].rw_values = calloc(gpio_group[i].num_gpio_lines, sizeof(unsigned char));
        if (gpio_group[i].rw_values == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        gpio_group[i].gpio_group_to_pins_table = calloc(gpio_group[i].num_gpio_lines, sizeof(int));
        if (gpio_group[i].gpio_group_to_pins_table == NULL) {
            syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
            mraa_gpio_close(dev);
            return NULL;
        }

        /* Set event handle arrays for all lines contained on a chip to NULL. */
        gpio_group[i].event_handles = NULL;
    }

    /* Finally map the inverse relation between a gpio group and its original pin numbers
     * provided by user. */
    int* counters = calloc(dev->num_chips, sizeof(int));
    if (counters == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for local variable");
        mraa_gpio_close(dev);
        return NULL;
    }

    for (int i = 0; i < num_pins; ++i) {
        int chip = dev->pin_to_gpio_table[i];
        gpio_group[chip].gpio_group_to_pins_table[counters[chip]] = i;
        counters[chip]++;
    }
    free(counters);

    /* Save the provided array from the user to our internal structure. */
    dev->provided_pins = malloc(dev->num_pins * sizeof(int));
    if (dev->provided_pins == NULL) {
        syslog(LOG_CRIT, "[GPIOD_INTERFACE]: Failed to allocate memory for internal member");
        mraa_gpio_close(dev);
        return NULL;
    }

    memcpy(dev->provided_pins, pins, dev->num_pins * sizeof(int));

    /* Initialize events array. */
    dev->events = NULL;

    return dev;
}